

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::focusInEvent(QGraphicsView *this,QFocusEvent *event)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  QGraphicsViewPrivate::updateInputMethodSensitivity(this_00);
  QWidget::focusInEvent((QWidget *)this,event);
  pDVar1 = (this_00->scene).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this_00->scene).wp.value != (QObject *)0x0)) {
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar2 = (QObject *)0x0;
    }
    else {
      pQVar2 = (this_00->scene).wp.value;
    }
    QCoreApplication::sendEvent(pQVar2,(QEvent *)event);
  }
  pDVar1 = (this_00->scene).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (((this_00->scene).wp.value != (QObject *)0x0 && (event[0xc] != (QFocusEvent)0x0)))) {
    return;
  }
  QWidget::focusInEvent((QWidget *)this,event);
  return;
}

Assistant:

void QGraphicsView::focusInEvent(QFocusEvent *event)
{
    Q_D(QGraphicsView);
    d->updateInputMethodSensitivity();
    QAbstractScrollArea::focusInEvent(event);
    if (d->scene)
        QCoreApplication::sendEvent(d->scene, event);
    // Pass focus on if the scene cannot accept focus.
    if (!d->scene || !event->isAccepted())
        QAbstractScrollArea::focusInEvent(event);
}